

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  uint uVar1;
  char **__src;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *__dest;
  char **ppcVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  uVar8 = (ulong)(uint)(this->History).Size;
  do {
    if ((int)uVar8 < 1) {
      iVar2 = (this->History).Size;
      goto LAB_0014f155;
    }
    lVar9 = uVar8 - 1;
    uVar8 = uVar8 - 1;
    iVar2 = Stricmp((this->History).Data[lVar9],command_line);
  } while (iVar2 != 0);
  free((this->History).Data[uVar8]);
  ppcVar6 = (this->History).Data;
  uVar8 = uVar8 & 0xffffffff;
  memmove(ppcVar6 + uVar8,ppcVar6 + uVar8 + 1,(~uVar8 + (long)(this->History).Size) * 8);
  iVar2 = (this->History).Size + -1;
  (this->History).Size = iVar2;
LAB_0014f155:
  sVar5 = strlen(command_line);
  __dest = (char *)malloc(sVar5 + 1);
  memcpy(__dest,command_line,sVar5 + 1);
  if (iVar2 == (this->History).Capacity) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar3) {
      iVar7 = iVar3;
    }
    ppcVar6 = (char **)ImGui::MemAlloc((long)iVar7 << 3);
    __src = (this->History).Data;
    if (__src != (char **)0x0) {
      memcpy(ppcVar6,__src,(long)(this->History).Size << 3);
      ImGui::MemFree((this->History).Data);
    }
    (this->History).Data = ppcVar6;
    (this->History).Capacity = iVar7;
    iVar2 = (this->History).Size;
  }
  else {
    ppcVar6 = (this->History).Data;
  }
  ppcVar6[iVar2] = __dest;
  (this->History).Size = (this->History).Size + 1;
  iVar2 = Stricmp(command_line,"CLEAR");
  if (iVar2 == 0) {
    ClearLog(this);
  }
  else {
    iVar2 = Stricmp(command_line,"HELP");
    if (iVar2 == 0) {
      AddLog(this,"Commands:");
      if (0 < (this->Commands).Size) {
        lVar9 = 0;
        do {
          AddLog(this,"- %s",(this->Commands).Data[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->Commands).Size);
      }
    }
    else {
      iVar2 = Stricmp(command_line,"HISTORY");
      if (iVar2 == 0) {
        uVar1 = (this->History).Size;
        uVar4 = 10;
        if (10 < (int)uVar1) {
          uVar4 = uVar1;
        }
        if ((int)(uVar4 - 10) < (int)uVar1) {
          uVar8 = (ulong)uVar4 - 10;
          do {
            AddLog(this,"%3d: %s\n",uVar8 & 0xffffffff,(this->History).Data[uVar8]);
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)(this->History).Size);
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size - 1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }